

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

size_t restincurl::
       InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::write_callback(char *ptr,size_t size,size_t nitems,void *userdata)

{
  undefined8 uVar1;
  size_t sVar2;
  long lVar3;
  
  if (userdata != (void *)0x0) {
    sVar2 = nitems * size;
    if ((sVar2 != 0) && (0 < (long)sVar2)) {
      uVar1 = *(undefined8 *)((long)userdata + 8);
      lVar3 = sVar2 + 1;
      do {
        std::__cxx11::string::push_back((char)uVar1);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    return sVar2;
  }
  __assert_fail("userdata",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x19b,
                "static size_t restincurl::InDataHandler<std::basic_string<char>>::write_callback(char *, size_t, size_t, void *) [T = std::basic_string<char>]"
               );
}

Assistant:

static size_t write_callback(char *ptr, size_t size, size_t nitems, void *userdata) {
            assert(userdata);
            auto self = reinterpret_cast<InDataHandler *>(userdata);
            const auto bytes = size * nitems;
            if (bytes > 0) {
                std::copy(ptr, ptr + bytes, std::back_inserter(self->data_));
            }
            return bytes;
        }